

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuffer.c
# Opt level: O3

int memptr_cmp_nocase(memptr *m,char *s)

{
  ulong __n;
  int iVar1;
  size_t sVar2;
  
  __n = m->length;
  iVar1 = strncasecmp(m->buf,s,__n);
  if ((iVar1 == 0) && (sVar2 = strlen(s), __n < sVar2)) {
    return -1;
  }
  return iVar1;
}

Assistant:

int memptr_cmp_nocase(memptr *m, const char *s)
{
	int cmp;

	cmp = strncasecmp(m->buf, s, m->length);
	if (cmp == 0 && m->length < strlen(s)) {
		/* both strings equal for 'm->length' chars */
		/*  if m is shorter than s, then s is greater */
		return -1;
	}

	return cmp;
}